

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMaxUp
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *param_3,bool updateOverlaps)

{
  short *psVar1;
  ushort uVar2;
  Handle *pHVar3;
  btOverlappingPairCallback *pbVar4;
  ushort uVar5;
  ulong uVar6;
  Edge EVar7;
  undefined6 in_register_00000012;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  Edge *pEVar14;
  bool bVar15;
  
  lVar8 = (long)axis;
  uVar6 = CONCAT62(in_register_00000012,edge) & 0xffffffff;
  uVar5 = this->m_pEdges[lVar8][uVar6 + 1].m_handle;
  if (uVar5 != 0) {
    pEVar14 = this->m_pEdges[lVar8] + uVar6;
    uVar2 = pEVar14->m_handle;
    pHVar3 = this->m_pHandles;
    uVar10 = 1 << ((byte)axis & 0x1f) & 3;
    uVar9 = 1 << (sbyte)uVar10 & 3;
    EVar7.m_handle = 0;
    EVar7.m_pos = pEVar14->m_pos;
    do {
      if (EVar7.m_pos < pEVar14[1].m_pos) {
        return;
      }
      lVar11 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
               ((ulong)((uint)uVar5 * 0x50) - 0x1c);
      bVar15 = (pEVar14[1].m_pos & 1) == 0;
      lVar13 = 0x42;
      if (bVar15) {
        lVar13 = 0x3c;
      }
      if ((((bVar15 && updateOverlaps) &&
           (lVar13 = 0x3c,
           *(ushort *)(lVar11 + 0x3c + (ulong)(uVar10 * 2)) <=
           *(ushort *)((long)pHVar3->m_maxEdges + (ulong)(uVar10 * 2) + (ulong)((uint)uVar2 * 0x50))
           )) && (*(ushort *)
                   ((long)(&(pHVar3->super_btBroadphaseProxy).m_aabbMax + 1) +
                   (ulong)(uVar10 * 2) + (ulong)((uint)uVar2 * 0x50)) <=
                  *(ushort *)(lVar11 + 0x42 + (ulong)(uVar10 * 2)))) &&
         ((uVar6 = (ulong)(uVar9 * 2),
          *(ushort *)(lVar11 + 0x3c + uVar6) <=
          *(ushort *)((long)pHVar3->m_maxEdges + uVar6 + (uint)uVar2 * 0x50) &&
          (uVar6 = (ulong)(uVar9 * 2),
          *(ushort *)
           ((long)(&(pHVar3->super_btBroadphaseProxy).m_aabbMax + 1) + uVar6 + (uint)uVar2 * 0x50)
          <= *(ushort *)(lVar11 + 0x42 + uVar6))))) {
        lVar12 = (long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                 ((ulong)((uint)pEVar14->m_handle * 0x50) - 0x1c);
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
                  (this->m_pairCache,lVar12,lVar11);
        pbVar4 = this->m_userPairCallback;
        if (pbVar4 != (btOverlappingPairCallback *)0x0) {
          (*pbVar4->_vptr_btOverlappingPairCallback[2])(pbVar4,lVar12,lVar11);
        }
      }
      psVar1 = (short *)(lVar11 + lVar13 + lVar8 * 2);
      *psVar1 = *psVar1 + -1;
      psVar1 = (short *)((long)pHVar3->m_maxEdges + lVar8 * 2 + (ulong)((uint)uVar2 * 0x50));
      *psVar1 = *psVar1 + 1;
      EVar7 = *pEVar14;
      *pEVar14 = pEVar14[1];
      pEVar14[1] = EVar7;
      uVar5 = pEVar14[2].m_handle;
      pEVar14 = pEVar14 + 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1  << axis) & 3;
		const int axis2 = (1  << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext,axis1,axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0,handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0,handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
	
}